

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O1

Reals __thiscall
Omega_h::coarsen_qualities(Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  Alloc *pAVar4;
  Omega_h_Parting OVar5;
  LO nmetrics;
  uint uVar6;
  undefined8 uVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  char *pcVar9;
  char *pcVar10;
  Reals RVar11;
  Write<int> cands2verts;
  LOs edges2verts;
  Read<double> metrics;
  LOs local_158;
  LOs local_148;
  LOs local_138;
  LOs local_128;
  LOs local_118;
  Alloc *local_108;
  undefined8 uStack_100;
  long local_f8 [3];
  Write<int> local_e0;
  Read<int> local_d0;
  Alloc *local_c0;
  void *local_b8;
  Alloc *local_b0;
  element_type *local_a8;
  Read<signed_char> local_a0;
  Read<signed_char> local_90;
  Read<signed_char> local_80;
  Read<signed_char> local_70;
  Reals local_60;
  Alloc *local_50;
  element_type *local_48;
  Read<signed_char> local_40;
  void *pvVar8;
  
  OVar5 = Mesh::parting(mesh);
  if (OVar5 != OMEGA_H_GHOSTED) {
    fail("assertion %s failed at %s +%d\n","mesh->parting() == OMEGA_H_GHOSTED",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
         ,0x42);
  }
  local_108 = (Alloc *)local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"metric","");
  Mesh::get_array<double>((Mesh *)&local_50,(Int)mesh,(string *)0x0);
  if (local_108 != (Alloc *)local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  nmetrics = Mesh::nverts(mesh);
  local_60.write_.shared_alloc_.alloc = local_50;
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
    }
    else {
      local_50->use_count = local_50->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = local_48;
  uVar6 = get_metrics_dim(nmetrics,&local_60);
  pAVar4 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  local_108 = (Alloc *)0x0;
  uStack_100 = 0;
  uVar3 = mesh->dim_;
  if (3 < uVar3) {
    uVar7 = 0x33;
    pcVar9 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    pcVar10 = "0 <= dim_ && dim_ <= 3";
LAB_0025933d:
    fail("assertion %s failed at %s +%d\n",pcVar10,pcVar9,uVar7);
  }
  if (uVar6 == 3 && (uVar3 ^ 3) == 0) {
    local_118.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.write_.shared_alloc_.alloc)->use_count =
             (local_118.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_118.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_70.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70.write_.shared_alloc_.alloc =
             (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_70.write_.shared_alloc_.alloc)->use_count =
             (local_70.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_70.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<3,3>(this,mesh,&local_118,&local_70);
    pAVar4 = local_70.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_b0 = local_118.write_.shared_alloc_.alloc;
    if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
        local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX;
        local_b0 = local_118.write_.shared_alloc_.alloc;
      }
    }
  }
  else if (uVar6 == 2 && (uVar3 ^ 2) == 0) {
    local_128.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.write_.shared_alloc_.alloc)->use_count =
             (local_128.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_80.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_80.write_.shared_alloc_.alloc =
             (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_80.write_.shared_alloc_.alloc)->use_count =
             (local_80.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_80.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<2,2>(this,mesh,&local_128,&local_80);
    pAVar4 = local_80.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_b0 = local_128.write_.shared_alloc_.alloc;
    if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
        local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_00;
        local_b0 = local_128.write_.shared_alloc_.alloc;
      }
    }
  }
  else if ((uVar3 ^ 3) == 0 && (uVar6 ^ 1) == 0) {
    local_138.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
        local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_138.write_.shared_alloc_.alloc =
             (Alloc *)((local_138.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_138.write_.shared_alloc_.alloc)->use_count =
             (local_138.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_138.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_90.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_90.write_.shared_alloc_.alloc =
             (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_90.write_.shared_alloc_.alloc)->use_count =
             (local_90.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_90.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<3,1>(this,mesh,&local_138,&local_90);
    pAVar4 = local_90.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_b0 = local_138.write_.shared_alloc_.alloc;
    if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
        local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_01;
        local_b0 = local_138.write_.shared_alloc_.alloc;
      }
    }
  }
  else if ((uVar6 ^ 1) == 0 && (uVar3 ^ 2) == 0) {
    local_148.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.write_.shared_alloc_.alloc)->use_count =
             (local_148.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_a0.write_.shared_alloc_.alloc = (cand_codes->write_).shared_alloc_.alloc;
    if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a0.write_.shared_alloc_.alloc =
             (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a0.write_.shared_alloc_.alloc)->use_count =
             (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a0.write_.shared_alloc_.direct_ptr = (cand_codes->write_).shared_alloc_.direct_ptr;
    RVar11 = coarsen_qualities_tmpl<2,1>(this,mesh,&local_148,&local_a0);
    pAVar4 = local_a0.write_.shared_alloc_.alloc;
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    local_b0 = local_148.write_.shared_alloc_.alloc;
    if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_a0.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_02;
        local_b0 = local_148.write_.shared_alloc_.alloc;
      }
    }
  }
  else {
    if (uVar3 != 1) {
      uVar7 = 0x57;
      pcVar9 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
      ;
      pcVar10 = "false";
      goto LAB_0025933d;
    }
    Mesh::ask_verts_of((Mesh *)&local_b0,(Int)mesh);
    local_158.write_.shared_alloc_.alloc = (cands2edges->write_).shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_158.write_.shared_alloc_.alloc =
             (Alloc *)((local_158.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_158.write_.shared_alloc_.alloc)->use_count =
             (local_158.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_158.write_.shared_alloc_.direct_ptr = (cands2edges->write_).shared_alloc_.direct_ptr;
    local_d0.write_.shared_alloc_.alloc = local_b0;
    if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0.write_.shared_alloc_.alloc = (Alloc *)(local_b0->size * 8 + 1);
      }
      else {
        local_b0->use_count = local_b0->use_count + 1;
      }
    }
    local_d0.write_.shared_alloc_.direct_ptr = local_a8;
    unmap<int>((Omega_h *)&local_c0,&local_158,&local_d0,2);
    pAVar4 = local_d0.write_.shared_alloc_.alloc;
    if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d0.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d0.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    pAVar4 = local_158.write_.shared_alloc_.alloc;
    if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
        local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    local_e0.shared_alloc_.alloc = local_c0;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e0.shared_alloc_.alloc = (Alloc *)(local_c0->size * 8 + 1);
      }
      else {
        local_c0->use_count = local_c0->use_count + 1;
      }
    }
    local_e0.shared_alloc_.direct_ptr = local_b8;
    Read<int>::Read(&local_40,&local_e0);
    RVar11 = get_1d_cavity_qualities(this,mesh,0,(LOs *)&local_40);
    pvVar8 = RVar11.write_.shared_alloc_.direct_ptr;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_40.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(local_40.write_.shared_alloc_.alloc,0x48);
        pvVar8 = extraout_RDX_03;
      }
    }
    pAVar4 = local_e0.shared_alloc_.alloc;
    if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 &&
        local_e0.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
        pvVar8 = extraout_RDX_04;
      }
    }
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      piVar1 = &local_c0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c0);
        operator_delete(local_c0,0x48);
        pvVar8 = extraout_RDX_05;
      }
    }
  }
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    piVar1 = &local_b0->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_b0);
      operator_delete(local_b0,0x48);
      pvVar8 = extraout_RDX_06;
    }
  }
  pAVar4 = local_108;
  if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
    piVar1 = &local_108->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108);
      operator_delete(pAVar4,0x48);
      pvVar8 = extraout_RDX_07;
    }
  }
  if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
    piVar1 = &local_50->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_50);
      operator_delete(local_50,0x48);
      pvVar8 = extraout_RDX_08;
    }
  }
  RVar11.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar11.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar11.write_.shared_alloc_;
}

Assistant:

Reals coarsen_qualities(Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->parting() == OMEGA_H_GHOSTED);
  auto metrics = mesh->get_array<Real>(VERT, "metric");
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  auto cand_quals = Reals();
  if (mesh->dim() == 3 && metric_dim == 3) {
    return coarsen_qualities_tmpl<3, 3>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 2) {
    return coarsen_qualities_tmpl<2, 2>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 3 && metric_dim == 1) {
    return coarsen_qualities_tmpl<3, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 2 && metric_dim == 1) {
    return coarsen_qualities_tmpl<2, 1>(mesh, cands2edges, cand_codes);
  }
  if (mesh->dim() == 1) {
    auto edges2verts = mesh->ask_verts_of(EDGE);
    auto cands2verts = unmap(cands2edges, edges2verts, 2);
    return get_1d_cavity_qualities(mesh, VERT, cands2verts);
  }
  OMEGA_H_NORETURN(Reals());
}